

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::Message::CopyWithSizeCheck(Message *to,Message *from)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var_00;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  long local_20;
  size_t from_size;
  Message *from_local;
  Message *to_local;
  
  from_size = (size_t)from;
  from_local = to;
  iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[8])();
  local_20 = CONCAT44(extraout_var,iVar2);
  (*(from_local->super_MessageLite)._vptr_MessageLite[4])();
  lVar1 = local_20;
  lVar3 = (**(code **)(*(long *)from_size + 0x40))();
  local_59 = 0;
  if (lVar1 != lVar3) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x7e);
    local_59 = 1;
    pLVar4 = internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (from_size) == (from.ByteSizeLong()): ");
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,
                        "Source of CopyFrom changed when clearing target.  Either source is a nested message in target (not allowed), or another thread is modifying the source."
                       );
    internal::LogFinisher::operator=(local_6d,pLVar4);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  iVar2 = (*(from_local->super_MessageLite)._vptr_MessageLite[0x12])();
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 8))(from_local,from_size);
  return;
}

Assistant:

void Message::CopyWithSizeCheck(Message* to, const Message& from) {
#ifndef NDEBUG
  size_t from_size = from.ByteSizeLong();
#endif
  to->Clear();
#ifndef NDEBUG
  GOOGLE_CHECK_EQ(from_size, from.ByteSizeLong())
      << "Source of CopyFrom changed when clearing target.  Either "
         "source is a nested message in target (not allowed), or "
         "another thread is modifying the source.";
#endif
  to->GetClassData()->merge_to_from(to, from);
}